

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

wchar_t archive_wstring_append_from_mbs(archive_wstring *dest,char *p,size_t len)

{
  archive_string *paVar1;
  size_t sVar2;
  size_t sVar3;
  int *piVar4;
  wchar_t *__pwc;
  mbstate_t_conflict shift_state;
  wchar_t local_3c;
  mbstate_t local_38;
  
  local_38.__count = 0;
  local_38.__value = (_union_27)0x0;
  paVar1 = archive_string_ensure((archive_string *)dest,(dest->length + len) * 4 + 4);
  local_3c = L'\xffffffff';
  if (paVar1 != (archive_string *)0x0) {
    __pwc = dest->s + dest->length;
    if (len == 0 || *p == '\0') {
      local_3c = L'\0';
    }
    else {
      local_3c = L'\0';
      sVar2 = len;
      do {
        while( true ) {
          if (sVar2 == 0) {
            sVar2 = (long)__pwc - (long)dest->s >> 2;
            dest->length = sVar2;
            *__pwc = L'\0';
            paVar1 = archive_string_ensure((archive_string *)dest,(sVar2 + len) * 4 + 4);
            if (paVar1 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            __pwc = dest->s + dest->length;
            sVar2 = len;
          }
          sVar3 = mbrtowc(__pwc,p,sVar2,&local_38);
          if (0xfffffffffffffffd < sVar3) break;
          if ((len <= sVar3 - 1) || (__pwc = __pwc + 1, p[sVar3] == '\0')) goto LAB_004330fb;
          sVar2 = sVar2 - 1;
          p = p + sVar3;
          len = len - sVar3;
          if (len == 0) goto LAB_004330fb;
        }
        piVar4 = __errno_location();
        if (*piVar4 != 0x54) {
          local_3c = L'\xffffffff';
          break;
        }
        local_3c = L'\xffffffff';
        if (p[1] == '\0') break;
        p = p + 1;
        len = len - 1;
      } while (len != 0);
    }
LAB_004330fb:
    dest->length = (long)__pwc - (long)dest->s >> 2;
    *__pwc = L'\0';
  }
  return local_3c;
}

Assistant:

int
archive_wstring_append_from_mbs(struct archive_wstring *dest,
    const char *p, size_t len)
{
	size_t r;
	int ret_val = 0;
	/*
	 * No single byte will be more than one wide character,
	 * so this length estimate will always be big enough.
	 */
	size_t wcs_length = len;
	size_t mbs_length = len;
	const char *mbs = p;
	wchar_t *wcs;
#if HAVE_MBRTOWC
	mbstate_t shift_state;

	memset(&shift_state, 0, sizeof(shift_state));
#endif
	if (NULL == archive_wstring_ensure(dest, dest->length + wcs_length + 1))
		return (-1);
	wcs = dest->s + dest->length;
	/*
	 * We cannot use mbsrtowcs/mbstowcs here because those may convert
	 * extra MBS when strlen(p) > len and one wide character consis of
	 * multi bytes.
	 */
	while (*mbs && mbs_length > 0) {
		if (wcs_length == 0) {
			dest->length = wcs - dest->s;
			dest->s[dest->length] = L'\0';
			wcs_length = mbs_length;
			if (NULL == archive_wstring_ensure(dest,
			    dest->length + wcs_length + 1))
				return (-1);
			wcs = dest->s + dest->length;
		}
#if HAVE_MBRTOWC
		r = mbrtowc(wcs, mbs, wcs_length, &shift_state);
#else
		r = mbtowc(wcs, mbs, wcs_length);
#endif
		if (r == (size_t)-1 || r == (size_t)-2) {
			ret_val = -1;
			if (errno == EILSEQ) {
				++mbs;
				--mbs_length;
				continue;
			} else
				break;
		}
		if (r == 0 || r > mbs_length)
			break;
		wcs++;
		wcs_length--;
		mbs += r;
		mbs_length -= r;
	}
	dest->length = wcs - dest->s;
	dest->s[dest->length] = L'\0';
	return (ret_val);
}